

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

Gia_Man_t * Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *p,int fUseFanout,int fXorTrick)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  Vec_Int_t *vCarries;
  int *__s;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pGVar10;
  Tim_Man_t *pTVar11;
  Gia_Man_t *pGVar12;
  long lVar13;
  Gia_Obj_t *pGVar14;
  uint uVar15;
  Gia_Obj_t *pGVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  Gia_Obj_t *pGVar20;
  uint uVar21;
  int local_54;
  
  local_54 = Gia_ManBoxNum(p);
  Gia_ManCleanPhase(p);
  lVar6 = (long)p->vCis->nSize;
  if (0 < lVar6) {
    lVar13 = 0;
    do {
      iVar4 = p->vCis->pArray[lVar13];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_005dcf7a;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (((undefined1  [12])p->pObjs[iVar4] & (undefined1  [12])0x4000000040000000) !=
          (undefined1  [12])0x0) {
        __assert_fail("!pObj->fMark0 && !pObj->fMark1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x36c,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
      }
      lVar13 = lVar13 + 1;
    } while (lVar6 != lVar13);
  }
  lVar6 = (long)p->vCos->nSize;
  if (0 < lVar6) {
    lVar13 = 0;
    do {
      iVar4 = p->vCos->pArray[lVar13];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_005dcf7a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (((undefined1  [12])p->pObjs[iVar4] & (undefined1  [12])0x4000000040000000) !=
          (undefined1  [12])0x0) {
        __assert_fail("!pObj->fMark0 && !pObj->fMark1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x36e,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
      }
      lVar13 = lVar13 + 1;
    } while (lVar6 != lVar13);
  }
  iVar4 = p->nObjs;
  if ((0 < iVar4) && (pGVar16 = p->pObjs, pGVar16 != (Gia_Obj_t *)0x0)) {
    lVar6 = 0;
    do {
      uVar18 = *(ulong *)pGVar16;
      uVar17 = uVar18 & 0x1fffffff;
      if (uVar17 != 0x1fffffff && -1 < (int)(uint)uVar18) {
        if ((~uVar18 & 0x4000000040000000) == 0) {
          __assert_fail("!pObj->fMark0 || !pObj->fMark1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                        ,0x371,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)")
          ;
        }
        if (((uint)uVar18 >> 0x1e & 1) != 0) {
          if ((long)*(ulong *)(pGVar16 + -uVar17) < 0) {
            __assert_fail("Gia_ObjFanin0(pObj)->fPhase == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                          ,0x374,
                          "Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
          }
          *(ulong *)(pGVar16 + -uVar17) = *(ulong *)(pGVar16 + -uVar17) | 0x8000000000000000;
        }
        if ((*(ulong *)pGVar16 & 0x4000000000000000) != 0) {
          uVar18 = (ulong)((uint)(*(ulong *)pGVar16 >> 0x20) & 0x1fffffff);
          if ((long)*(ulong *)(pGVar16 + -uVar18) < 0) {
            __assert_fail("Gia_ObjFanin1(pObj)->fPhase == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                          ,0x379,
                          "Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
          }
          *(ulong *)(pGVar16 + -uVar18) = *(ulong *)(pGVar16 + -uVar18) | 0x8000000000000000;
        }
      }
      lVar6 = lVar6 + 1;
      iVar4 = p->nObjs;
    } while ((lVar6 < iVar4) && (pGVar16 = p->pObjs + lVar6, p->pObjs != (Gia_Obj_t *)0x0));
  }
  if (fUseFanout == 0) {
    vCarries = (Vec_Int_t *)malloc(0x10);
    iVar5 = 0x10;
    if (0xe < iVar4 - 1U) {
      iVar5 = iVar4;
    }
    vCarries->nSize = 0;
    vCarries->nCap = iVar5;
    if (iVar5 == 0) {
      __s = (int *)0x0;
    }
    else {
      __s = (int *)malloc((long)iVar5 << 2);
    }
    vCarries->pArray = __s;
    vCarries->nSize = iVar4;
    memset(__s,0xff,(long)iVar4 << 2);
  }
  else {
    vCarries = (Vec_Int_t *)0x0;
  }
  if (vCarries != (Vec_Int_t *)0x0) {
    Gia_ManCreateRefs(p);
    uVar18 = (ulong)(uint)p->nObjs;
    if ((0 < p->nObjs) && (pGVar16 = p->pObjs, pGVar16 != (Gia_Obj_t *)0x0)) {
      lVar6 = 0;
      pGVar14 = pGVar16;
      do {
        uVar17 = *(ulong *)pGVar14;
        uVar19 = uVar17 & 0x1fffffff;
        if (uVar19 != 0x1fffffff && -1 < (int)(uint)uVar17) {
          if (((uint)uVar17 >> 0x1e & 1) == 0) {
            if ((uVar17 & 0x4000000000000000) == 0) goto LAB_005dc8a2;
            pGVar20 = (Gia_Obj_t *)
                      ((long)pGVar14 + (ulong)((uint)(uVar17 >> 0x1e) & 0x7ffffffc) * -3);
            if ((pGVar20 < pGVar16) || (pGVar16 + (int)uVar18 <= pGVar20)) goto LAB_005dcf5b;
          }
          else {
            pGVar20 = (Gia_Obj_t *)((long)pGVar14 + (ulong)(uint)((int)uVar19 * 4) * -3);
            if ((pGVar20 < pGVar16) || (pGVar16 + (int)uVar18 <= pGVar20)) goto LAB_005dcf5b;
            pGVar20 = pGVar16 + (lVar6 - uVar19);
          }
          p->pRefs[(int)((ulong)((long)pGVar20 - (long)pGVar16) >> 2) * -0x55555555] =
               p->pRefs[(int)((ulong)((long)pGVar20 - (long)pGVar16) >> 2) * -0x55555555] + -1;
        }
LAB_005dc8a2:
        lVar6 = lVar6 + 1;
        uVar18 = (ulong)p->nObjs;
        pGVar14 = pGVar14 + 1;
      } while (lVar6 < (long)uVar18);
    }
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pName = pcVar8;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pSpec = pcVar8;
  p->pObjs->Value = 0;
  if (1 < p->nObjs) {
    lVar6 = 1;
    lVar13 = 0x14;
    do {
      pGVar16 = p->pObjs;
      uVar18 = *(ulong *)((long)pGVar16 + lVar13 + -8);
      uVar3 = (uint)uVar18;
      if ((uVar3 & 0x9fffffff) == 0x9fffffff) {
        pGVar20 = Gia_ManAppendObj(p_00);
        uVar18 = *(ulong *)pGVar20;
        *(ulong *)pGVar20 = uVar18 | 0x9fffffff;
        *(ulong *)pGVar20 =
             uVar18 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar14 = p_00->pObjs;
        if ((pGVar20 < pGVar14) || (pGVar14 + p_00->nObjs <= pGVar20)) goto LAB_005dcf5b;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar20 - (long)pGVar14) >> 2) * -0x55555555);
        pGVar14 = p_00->pObjs;
        if ((pGVar20 < pGVar14) || (pGVar14 + p_00->nObjs <= pGVar20)) goto LAB_005dcf5b;
        *(int *)(&pGVar16->field_0x0 + lVar13) =
             (int)((ulong)((long)pGVar20 - (long)pGVar14) >> 2) * 0x55555556;
      }
      else {
        iVar4 = (int)(uVar18 & 0x1fffffff);
        if ((uVar18 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar3) {
          if ((uVar18 & 0x4000000040000000) != 0) {
            if (((uint)(uVar18 >> 0x1e) & 1) == (uint)((uVar18 >> 0x3e & 1) != 0)) {
              __assert_fail("pObj->fMark0 != pObj->fMark1",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                            ,0x39b,
                            "Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
            }
            pGVar14 = (Gia_Obj_t *)((long)pGVar16 + lVar13 + -8);
            if ((uVar18 >> 0x1e & 1) == 0) {
              uVar3 = Gia_ObjFanin1CopyCarry(vCarries,pGVar14,(int)lVar6);
            }
            else {
              uVar3 = Gia_ObjFanin0CopyCarry(vCarries,pGVar14,(int)lVar6);
            }
            uVar18 = *(ulong *)pGVar14;
            if (((uint)uVar18 >> 0x1e & 1) == 0) {
              uVar15 = *(uint *)((long)pGVar16 +
                                lVar13 + (ulong)(((uint)uVar18 & 0x1fffffff) << 2) * -3);
              if ((int)uVar15 < 0) goto LAB_005dcf99;
              uVar21 = (uint)(uVar18 >> 0x1d) & 7;
            }
            else {
              uVar15 = *(uint *)((long)pGVar16 +
                                lVar13 + (ulong)((uint)(uVar18 >> 0x1e) & 0x7ffffffc) * -3);
              if ((int)uVar15 < 0) goto LAB_005dcf99;
              uVar21 = (uint)(uVar18 >> 0x3d);
            }
            uVar15 = uVar21 & 1 ^ uVar15;
            uVar21 = uVar3 & 1;
            Gia_ManAppendCo(p_00,uVar3 & 0x7ffffffe);
            Gia_ManAppendCo(p_00,uVar15 ^ uVar21);
            Gia_ManAppendCo(p_00,uVar21);
            pGVar9 = Gia_ManAppendObj(p_00);
            uVar18 = *(ulong *)pGVar9;
            *(ulong *)pGVar9 = uVar18 | 0x9fffffff;
            *(ulong *)pGVar9 =
                 uVar18 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar20 = p_00->pObjs;
            if ((pGVar20 <= pGVar9) && (pGVar9 < pGVar20 + p_00->nObjs)) {
              Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar20) >> 2) * -0x55555555
                         );
              pGVar20 = p_00->pObjs;
              if ((pGVar20 <= pGVar9) && (pGVar9 < pGVar20 + p_00->nObjs)) {
                pGVar10 = Gia_ManAppendObj(p_00);
                uVar18 = *(ulong *)pGVar10;
                *(ulong *)pGVar10 = uVar18 | 0x9fffffff;
                *(ulong *)pGVar10 =
                     uVar18 & 0xe0000000ffffffff | 0x9fffffff |
                     (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
                pGVar2 = p_00->pObjs;
                if ((pGVar2 <= pGVar10) && (pGVar10 < pGVar2 + p_00->nObjs)) {
                  Vec_IntPush(p_00->vCis,
                              (int)((ulong)((long)pGVar10 - (long)pGVar2) >> 2) * -0x55555555);
                  pGVar2 = p_00->pObjs;
                  if ((pGVar2 <= pGVar10) && (pGVar10 < pGVar2 + p_00->nObjs)) {
                    uVar3 = (int)((ulong)((long)pGVar10 - (long)pGVar2) >> 2) * 0x55555556;
                    if ((int)uVar3 < 0) goto LAB_005dcf99;
                    uVar3 = uVar3 | uVar21;
                    *(uint *)(&pGVar16->field_0x0 + lVar13) = uVar3;
                    if ((vCarries != (Vec_Int_t *)0x0) && (*(long *)pGVar14 < 0)) {
                      if (vCarries->nSize <= lVar6) {
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                      }
                      vCarries->pArray[lVar6] = uVar3;
                      pGVar2 = p->pObjs;
                      if ((pGVar14 < pGVar2) || (pGVar2 + p->nObjs <= pGVar14)) goto LAB_005dcf5b;
                      if (0 < p->pRefs[(int)((ulong)((long)pGVar16 + (lVar13 - (long)pGVar2) + -8)
                                            >> 2) * -0x55555555]) {
                        if (fXorTrick == 0) {
                          uVar18 = *(ulong *)((long)pGVar16 + lVar13 + -8);
                          uVar3 = *(uint *)((long)pGVar16 +
                                           (ulong)(((uint)uVar18 & 0x1fffffff) << 2) * -3 + lVar13);
                          if (((int)uVar3 < 0) ||
                             (uVar15 = *(uint *)((long)pGVar16 +
                                                lVar13 + (ulong)((uint)(uVar18 >> 0x1e) & 0x7ffffffc
                                                                ) * -3), (int)uVar15 < 0))
                          goto LAB_005dcf99;
                          uVar3 = (uint)(uVar18 >> 0x1d) & 1 ^ uVar3;
                          uVar15 = uVar15 ^ (uint)(uVar18 >> 0x3d) & 1;
                        }
                        else {
                          uVar3 = (int)((ulong)((long)pGVar9 - (long)pGVar20) >> 2) * 0x55555556;
                          if ((int)uVar3 < 0) {
LAB_005dcf99:
                            __assert_fail("Lit >= 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                          ,0xf5,"int Abc_LitNotCond(int, int)");
                          }
                          uVar3 = (uVar3 | uVar21) ^ 1;
                        }
                        iVar4 = Gia_ManAppendAnd(p_00,uVar3,uVar15);
                        *(int *)(&pGVar16->field_0x0 + lVar13) = iVar4;
                      }
                    }
                    local_54 = local_54 + 1;
                    goto LAB_005dce61;
                  }
                }
              }
            }
LAB_005dcf5b:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar3 = *(uint *)((long)pGVar16 + lVar13 + (ulong)(uint)(iVar4 << 2) * -3);
          if (((int)uVar3 < 0) ||
             (uVar15 = *(uint *)((long)pGVar16 +
                                lVar13 + (ulong)((uint)(uVar18 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar15 < 0)) goto LAB_005dcf99;
          iVar4 = Gia_ManAppendAnd(p_00,uVar3 ^ (uint)(uVar18 >> 0x1d) & 1,
                                   uVar15 ^ (uint)(uVar18 >> 0x3d) & 1);
        }
        else {
          uVar15 = *(uint *)((long)pGVar16 + lVar13 + (ulong)(uint)(iVar4 << 2) * -3);
          if ((int)uVar15 < 0) goto LAB_005dcf99;
          iVar4 = Gia_ManAppendCo(p_00,uVar15 ^ uVar3 >> 0x1d & 1);
        }
        *(int *)(&pGVar16->field_0x0 + lVar13) = iVar4;
      }
LAB_005dce61:
      lVar6 = lVar6 + 1;
      lVar13 = lVar13 + 0xc;
    } while (lVar6 < p->nObjs);
  }
  Gia_ManCleanPhase(p);
  if (vCarries != (Vec_Int_t *)0x0) {
    if (vCarries->pArray != (int *)0x0) {
      free(vCarries->pArray);
      vCarries->pArray = (int *)0x0;
    }
    free(vCarries);
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  iVar4 = Gia_ManHasDangling(p_00);
  if (iVar4 != 0) {
    __assert_fail("!Gia_ManHasDangling(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                  ,0x3bc,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
  }
  iVar4 = Gia_ManBoxNum(p);
  if (iVar4 == 0) {
    iVar4 = p->vCis->nSize;
  }
  else {
    iVar4 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
  }
  iVar5 = Gia_ManBoxNum(p);
  if (iVar5 == 0) {
    iVar5 = p->vCos->nSize;
  }
  else {
    iVar5 = Tim_ManPoNum((Tim_Man_t *)p->pManTime);
  }
  pTVar11 = Gia_ManGenerateTim(iVar4,iVar5,local_54,3,2);
  p_00->pManTime = pTVar11;
  pGVar12 = Gia_ManGenerateExtraAig(local_54,3,2);
  p_00->pAigExtra = pGVar12;
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupWithArtificalFaddBoxes( Gia_Man_t * p, int fUseFanout, int fXorTrick )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;  
    int nBoxes = Gia_ManBoxNum(p);
    int i, nRealPis, nRealPos;
    Vec_Int_t * vCarries = NULL;
    // make sure two chains do not overlap
    Gia_ManCleanPhase( p );
    Gia_ManForEachCi( p, pObj, i )
        assert( !pObj->fMark0 && !pObj->fMark1 );
    Gia_ManForEachCo( p, pObj, i )
        assert( !pObj->fMark0 && !pObj->fMark1 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        assert( !pObj->fMark0 || !pObj->fMark1 );
        if ( pObj->fMark0 )
        {
            assert( Gia_ObjFanin0(pObj)->fPhase == 0 );
            Gia_ObjFanin0(pObj)->fPhase = 1;
        }
        if ( pObj->fMark1 )
        {
            assert( Gia_ObjFanin1(pObj)->fPhase == 0 );
            Gia_ObjFanin1(pObj)->fPhase = 1;
        }
    }
    // create mapping for carry-chains
    if ( !fUseFanout )
        vCarries = Vec_IntStartFull( Gia_ManObjNum(p) );
    // create references and discount carries
    if ( vCarries )
    {
        Gia_ManCreateRefs( p );
        Gia_ManForEachAnd( p, pObj, i )
            if ( pObj->fMark0 )
                Gia_ObjRefFanin0Dec( p, pObj );
            else if ( pObj->fMark1 )
                Gia_ObjRefFanin1Dec( p, pObj );
    }
    // if AIG already has (natural) FADD boxes, it should not un-normalized
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( !pObj->fMark0 && !pObj->fMark1 ) // AND-gate
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else // AND-gate with chain
        {
            int iCiLit, iOtherLit, iLit0, iLit1, iLit2, iXorLit;
            assert( pObj->fMark0 != pObj->fMark1 );
            iCiLit    = pObj->fMark0 ? Gia_ObjFanin0CopyCarry(vCarries, pObj, i) : Gia_ObjFanin1CopyCarry(vCarries, pObj, i);
            iOtherLit = pObj->fMark0 ? Gia_ObjFanin1Copy(pObj) : Gia_ObjFanin0Copy(pObj);
            assert( iCiLit >= 0 && iOtherLit >= 0 );
            iLit0 = Abc_LitNotCond( iCiLit,    Abc_LitIsCompl(iCiLit) );
            iLit1 = Abc_LitNotCond( iOtherLit, Abc_LitIsCompl(iCiLit) );
            iLit2 = Abc_LitNotCond( 0,         Abc_LitIsCompl(iCiLit) );
            // add COs
            assert( !Abc_LitIsCompl(iLit0) );
            Gia_ManAppendCo( pNew, iLit0 );
            Gia_ManAppendCo( pNew, iLit1 );
            Gia_ManAppendCo( pNew, iLit2 );
            // add CI (unused sum bit)
            iXorLit = Gia_ManAppendCi(pNew);
            // add CI (carry bit)
            pObj->Value = Abc_LitNotCond( Gia_ManAppendCi(pNew), Abc_LitIsCompl(iCiLit) );
            if ( vCarries && pObj->fPhase )
            {
                Vec_IntWriteEntry( vCarries, i, pObj->Value );
                if ( Gia_ObjRefNum(p, pObj) > 0 )
                {
                    if ( fXorTrick )
                        pObj->Value = Gia_ManAppendAnd( pNew, Abc_LitNotCond(iXorLit, !Abc_LitIsCompl(iCiLit)), iOtherLit );
                    else
                        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
                }
            }
            nBoxes++;
        }
    }
    Gia_ManCleanPhase( p );
    Vec_IntFreeP( &vCarries );
    ABC_FREE( p->pRefs );
    assert( !Gia_ManHasDangling(pNew) );
    // other information
//    nBoxes += (Gia_ManCiNum(pNew) - Gia_ManCiNum(p)) / 2;
//    assert( nBoxes == Gia_ManBoxNum(p) + (Gia_ManCoNum(pNew) - Gia_ManCoNum(p)) / 3 );
    nRealPis = Gia_ManBoxNum(p) ? Tim_ManPiNum((Tim_Man_t *)p->pManTime) : Gia_ManCiNum(p);
    nRealPos = Gia_ManBoxNum(p) ? Tim_ManPoNum((Tim_Man_t *)p->pManTime) : Gia_ManCoNum(p);
    pNew->pManTime  = Gia_ManGenerateTim( nRealPis, nRealPos, nBoxes, 3, 2 );
    pNew->pAigExtra = Gia_ManGenerateExtraAig( nBoxes, 3, 2 );
    // optionally normalize the AIG
    return pNew;
}